

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_checkbox(mu_Context *ctx,char *label,int *state)

{
  mu_Id id_00;
  mu_Rect mVar1;
  mu_Rect rect;
  mu_Rect box;
  mu_Rect r;
  mu_Id id;
  int res;
  int *state_local;
  char *label_local;
  mu_Context *ctx_local;
  
  r.h = 0;
  _id = (uint *)state;
  state_local = (int *)label;
  label_local = (char *)ctx;
  id_00 = mu_get_id(ctx,&id,8);
  mVar1 = mu_layout_next((mu_Context *)label_local);
  box.w = mVar1.x;
  box.h = mVar1.y;
  r.y = mVar1.h;
  rect = mu_rect(box.w,box.h,r.y,r.y);
  mu_update_control((mu_Context *)label_local,id_00,mVar1,0);
  if ((*(int *)(label_local + 0x41f4c) == 1) && (*(mu_Id *)(label_local + 0x84) == id_00)) {
    r.h = 4;
    *_id = (uint)((*_id != 0 ^ 0xffU) & 1);
  }
  mu_draw_control_frame((mu_Context *)label_local,id_00,rect,9,0);
  if (*_id != 0) {
    mu_draw_icon((mu_Context *)label_local,2,rect,
                 *(mu_Color *)(*(long *)(label_local + 0x78) + 0x28));
  }
  box.x = rect.w;
  r.x = mVar1.w;
  mVar1 = mu_rect(box.w + box.x,box.h,r.x - box.x,r.y);
  mu_draw_control_text((mu_Context *)label_local,(char *)state_local,mVar1,0,0);
  return r.h;
}

Assistant:

int mu_checkbox(mu_Context *ctx, const char *label, int *state) {
  int res = 0;
  mu_Id id = mu_get_id(ctx, &state, sizeof(state));
  mu_Rect r = mu_layout_next(ctx);
  mu_Rect box = mu_rect(r.x, r.y, r.h, r.h);
  mu_update_control(ctx, id, r, 0);
  /* handle click */
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->focus == id) {
    res |= MU_RES_CHANGE;
    *state = !*state;
  }
  /* draw */
  mu_draw_control_frame(ctx, id, box, MU_COLOR_BASE, 0);
  if (*state) {
    mu_draw_icon(ctx, MU_ICON_CHECK, box, ctx->style->colors[MU_COLOR_TEXT]);
  }
  r = mu_rect(r.x + box.w, r.y, r.w - box.w, r.h);
  mu_draw_control_text(ctx, label, r, MU_COLOR_TEXT, 0);
  return res;
}